

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::asio_rpc_listener::stop(asio_rpc_listener *this)

{
  int in_ESI;
  
  std::mutex::lock(&this->listener_lock_);
  this->stopped_ = true;
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::close(&this->acceptor_,in_ESI);
  pthread_mutex_unlock((pthread_mutex_t *)&this->listener_lock_);
  return;
}

Assistant:

virtual void stop() override {
        auto_lock(listener_lock_);
        stopped_ = true;
        acceptor_.close();
    }